

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames.cpp
# Opt level: O0

void __thiscall
icu_63::TimeZoneNames::getDisplayNames
          (TimeZoneNames *this,UnicodeString *tzID,UTimeZoneNameType *types,int32_t numTypes,
          UDate date,UnicodeString *dest,UErrorCode *status)

{
  UBool UVar1;
  int local_84;
  undefined1 local_80 [4];
  int i;
  UnicodeString mzID;
  UErrorCode *status_local;
  UnicodeString *dest_local;
  UDate date_local;
  int32_t numTypes_local;
  UTimeZoneNameType *types_local;
  UnicodeString *tzID_local;
  TimeZoneNames *this_local;
  
  mzID.fUnion._48_8_ = status;
  UVar1 = ::U_FAILURE(*status);
  if ((UVar1 == '\0') && (UVar1 = UnicodeString::isEmpty(tzID), UVar1 == '\0')) {
    UnicodeString::UnicodeString((UnicodeString *)local_80);
    for (local_84 = 0; local_84 < numTypes; local_84 = local_84 + 1) {
      (*(this->super_UObject)._vptr_UObject[10])(this,tzID,(ulong)types[local_84],dest + local_84);
      UVar1 = UnicodeString::isEmpty(dest + local_84);
      if (UVar1 != '\0') {
        UVar1 = UnicodeString::isEmpty((UnicodeString *)local_80);
        if (UVar1 != '\0') {
          (*(this->super_UObject)._vptr_UObject[7])(date,this,tzID,local_80);
        }
        (*(this->super_UObject)._vptr_UObject[9])
                  (this,local_80,(ulong)types[local_84],dest + local_84);
      }
    }
    UnicodeString::~UnicodeString((UnicodeString *)local_80);
  }
  return;
}

Assistant:

void
TimeZoneNames::getDisplayNames(const UnicodeString& tzID, const UTimeZoneNameType types[], int32_t numTypes, UDate date, UnicodeString dest[], UErrorCode& status) const {
    if (U_FAILURE(status)) { return; }
    if (tzID.isEmpty()) { return; }
    UnicodeString mzID;
    for (int i = 0; i < numTypes; i++) {
        getTimeZoneDisplayName(tzID, types[i], dest[i]);
        if (dest[i].isEmpty()) {
            if (mzID.isEmpty()) {
                getMetaZoneID(tzID, date, mzID);
            }
            getMetaZoneDisplayName(mzID, types[i], dest[i]);
        }
    }
}